

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

bool __thiscall phyr::AccelBVH::intersectRay(AccelBVH *this,Ray *ray,SurfaceInteraction *si)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  bool bVar3;
  ushort uVar4;
  LinearBVHNode *this_00;
  int iVar5;
  long lVar6;
  int iVar7;
  int nodeStack [64];
  byte local_178;
  ulong local_168;
  uint local_160;
  undefined1 local_158 [16];
  double local_148;
  anon_union_4_2_b6662c1c_for_LinearBVHNode_1 aaStack_13c [67];
  
  local_148 = 1.0 / (ray->d).z;
  auVar1._0_8_ = (ray->d).x;
  auVar1._8_8_ = (ray->d).y;
  local_158 = divpd(_DAT_001790e0,auVar1);
  local_168 = CONCAT44(-(uint)(local_158._8_8_ < 0.0),-(uint)(local_158._0_8_ < 0.0)) & 0x100000001;
  local_160 = (uint)(local_148 < 0.0);
  iVar5 = 0;
  local_178 = 0;
  iVar7 = 0;
LAB_00139cfd:
  do {
    this_00 = this->bvhNodes + iVar5;
    bVar3 = Bounds3<double>::intersectRay
                      (&this_00->bounds,ray,(Vector3<double> *)local_158,(int *)&local_168);
    if (bVar3) {
      uVar4 = this_00->nObjects;
      if (uVar4 == 0) {
        if (*(int *)((long)&local_168 + (ulong)this_00->splitAxis * 4) == 0) {
          aaStack_13c[(long)iVar7 + 1] = this_00->field_1;
          iVar5 = iVar5 + 1;
          iVar7 = iVar7 + 1;
        }
        else {
          aaStack_13c[(long)iVar7 + 1].objectStartIdx = iVar5 + 1;
          iVar5 = (this_00->field_1).objectStartIdx;
          iVar7 = iVar7 + 1;
        }
        goto LAB_00139cfd;
      }
      for (lVar6 = 0; (uint)lVar6 < (uint)uVar4; lVar6 = lVar6 + 1) {
        peVar2 = (this->objectList).
                 super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [(this_00->field_1).objectStartIdx + lVar6].
                 super___shared_ptr<phyr::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar5 = (*peVar2->_vptr_Object[4])(peVar2,ray,si);
        local_178 = local_178 | (byte)iVar5;
        uVar4 = this_00->nObjects;
      }
    }
    if (iVar7 == 0) {
      return (bool)(local_178 & 1);
    }
    iVar5 = aaStack_13c[iVar7].objectStartIdx;
    iVar7 = iVar7 + -1;
  } while( true );
}

Assistant:

bool AccelBVH::intersectRay(const Ray& ray, SurfaceInteraction* si) const {
    bool intersected = false;
    // Initialize ray intersection parameters
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    int isDirNeg[3] = { invDir.x < 0, invDir.y < 0, invDir.z < 0 };

    // Test against each BVH node
    int nodeStack[64];
    int stackSize = 0, itrIdx = 0, i;

    while (true) {
        const LinearBVHNode* node = &bvhNodes[itrIdx];
        // Inspect current node
        if (node->bounds.intersectRay(ray, invDir, isDirNeg)) {
            if (node->nObjects > 0) {
                // Node is leaf. Test against all objects in leaf
                for (i = 0; i < node->nObjects; i++)
                    if (objectList[node->objectStartIdx + i]->intersectRay(ray, si))
                        intersected = true;
                if (stackSize == 0) break;
                itrIdx = nodeStack[--stackSize];
            } else {
                // Internal node. Test near nodes first. Put far nodes in the stack
                if (isDirNeg[node->splitAxis]) {
                    // Stash first child and inspect second child first
                    nodeStack[stackSize++] = itrIdx + 1;
                    itrIdx = node->secondChildIdx;
                } else {
                    // Stash second child and inspect first child first
                    nodeStack[stackSize++] = node->secondChildIdx;
                    itrIdx++;
                }
            }
        } else {
            if (stackSize == 0) break;
            itrIdx = nodeStack[--stackSize];
        }
    }

    return intersected;
}